

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV4MeshBones(Parser *this,uint iNumBones,Mesh *mesh)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  byte *__s2;
  byte *pbVar6;
  int local_7c;
  value_type local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"UNNAMED","");
  paVar1 = &local_70.mName.field_2;
  local_70.mName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_50 + local_48);
  std::vector<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>::resize
            (&mesh->mBones,(ulong)iNumBones,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.mName._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.mName._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  pbVar6 = (byte *)this->filePtr;
  local_7c = 0;
  do {
    bVar2 = *pbVar6;
    if (bVar2 == 0x2a) {
      while( true ) {
        __s2 = pbVar6 + 1;
        this->filePtr = (char *)__s2;
        iVar4 = strncmp("MESH_BONE_NAME",(char *)__s2,0xe);
        if (iVar4 != 0) break;
        bVar2 = pbVar6[0xf];
        if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
        __s2 = pbVar6 + 0x10;
        if (bVar2 == 0) {
          __s2 = pbVar6 + 0xf;
        }
        this->filePtr = (char *)__s2;
        for (; (*__s2 == 0x20 || (*__s2 == 9)); __s2 = __s2 + 1) {
        }
        this->filePtr = (char *)__s2;
        bVar2 = *__s2;
        if ((bVar2 < 0xe) && ((0x3401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        uVar5 = 0;
        if (0xf5 < (byte)(bVar2 - 0x3a)) {
          uVar5 = 0;
          do {
            uVar5 = (uint)(byte)(bVar2 - 0x30) + uVar5 * 10;
            bVar2 = __s2[1];
            __s2 = __s2 + 1;
          } while (0xf5 < (byte)(bVar2 - 0x3a));
        }
        this->filePtr = (char *)__s2;
        if (uVar5 < iNumBones) {
          bVar3 = ParseString(this,&(mesh->mBones).
                                    super__Vector_base<Assimp::ASE::Bone,_std::allocator<Assimp::ASE::Bone>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar5].mName,
                              "*MESH_BONE_NAME");
          if (!bVar3) {
            SkipToNextToken(this);
          }
        }
        else {
          LogWarning(this,"Bone index is out of bounds");
        }
        pbVar6 = (byte *)this->filePtr;
        __s2 = pbVar6;
        if (*pbVar6 != 0x2a) break;
      }
      pbVar6 = __s2;
      bVar2 = *pbVar6;
    }
    bVar3 = false;
    if (bVar2 < 0x7b) {
      if ((bVar2 - 0xc < 2) || (bVar2 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003d65ad;
        this->iLineNumber = this->iLineNumber + 1;
        bVar3 = true;
      }
      else if (bVar2 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a *MESH_BONE_LIST chunk (Level 3)");
      }
    }
    else {
      if (bVar2 == 0x7d) {
        local_7c = local_7c + -1;
        if (local_7c == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar2 != 0x7b) goto LAB_003d65af;
        local_7c = local_7c + 1;
      }
LAB_003d65ad:
      bVar3 = false;
    }
LAB_003d65af:
    this->bLastWasEndLine = bVar3;
    pbVar6 = pbVar6 + 1;
    this->filePtr = (char *)pbVar6;
  } while( true );
}

Assistant:

void Parser::ParseLV4MeshBones(unsigned int iNumBones,ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();
    mesh.mBones.resize(iNumBones, Bone("UNNAMED"));
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Mesh bone with name ...
            if (TokenMatch(filePtr,"MESH_BONE_NAME" ,14))
            {
                // parse an index ...
                if(SkipSpaces(&filePtr))
                {
                    unsigned int iIndex = strtoul10(filePtr,&filePtr);
                    if (iIndex >= iNumBones)
                    {
                        LogWarning("Bone index is out of bounds");
                        continue;
                    }
                    if (!ParseString(mesh.mBones[iIndex].mName,"*MESH_BONE_NAME"))
                        SkipToNextToken();
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_BONE_LIST");
    }
}